

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-sse2.c
# Opt level: O3

void fill_segment_sse2(argon2_instance_t *instance,argon2_position_t position)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t *puVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  block input_block;
  block address_block;
  __m128i state [64];
  argon2_position_t local_c50;
  ulong local_c40;
  block local_c38;
  block local_838;
  longlong local_438 [129];
  
  uVar5 = position._8_8_;
  uVar8 = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    uVar2 = position.pass;
    bVar10 = position.slice;
    local_c50._0_8_ = uVar8;
    local_c50._8_8_ = uVar5;
    if ((instance->type == Argon2_i) || ((instance->type == Argon2_id && uVar2 == 0) && bVar10 < 2))
    {
      uVar9 = 0;
      init_block_value(&local_c38,'\0');
      local_c38.v[0] = uVar8 & 0xffffffff;
      local_c38.v[2] = uVar5 & 0xff;
      local_c38.v[3] = (uint64_t)instance->memory_blocks;
      local_c38.v[4] = (uint64_t)instance->passes;
      local_c38.v[5] = (uint64_t)instance->type;
      bVar1 = true;
      local_c38.v[1] = uVar8 >> 0x20;
      if (bVar10 == 0 && uVar2 == 0) {
        next_addresses(&local_838,&local_c38);
        uVar9 = 2;
      }
    }
    else {
      uVar9 = (uint)(bVar10 == 0 && uVar2 == 0) * 2;
      bVar1 = false;
    }
    uVar7 = instance->segment_length;
    uVar12 = instance->lane_length;
    iVar6 = uVar12 * position.lane;
    iVar11 = (position._8_4_ & 0xff) * uVar7;
    uVar4 = iVar6 + uVar9 + iVar11;
    uVar5 = (ulong)((-(uint)(uVar4 % uVar12 != 0) | uVar12 - 1) + uVar4);
    memcpy(local_438,instance->memory + uVar5,0x400);
    if (uVar9 < uVar7) {
      local_c40 = (ulong)(uint)(iVar11 + iVar6);
      do {
        uVar7 = (int)local_c40 + uVar9;
        if (uVar7 % instance->lane_length == 1) {
          uVar5 = (ulong)(((int)local_c40 + uVar9) - 1);
        }
        if (bVar1) {
          if ((uVar9 & 0x7f) == 0) {
            next_addresses(&local_838,&local_c38);
          }
          puVar3 = local_838.v + (uVar9 & 0x7f);
        }
        else {
          puVar3 = instance->memory[uVar5].v;
        }
        uVar8 = (*puVar3 >> 0x20) % (ulong)instance->lanes;
        uVar12 = 0;
        uVar13 = uVar8;
        if (local_c50.slice == '\0') {
          uVar13 = (ulong)local_c50._0_8_ >> 0x20;
        }
        if (local_c50.pass != 0) {
          uVar13 = uVar8;
        }
        local_c50.index = uVar9;
        uVar2 = index_alpha(instance,&local_c50,(uint32_t)*puVar3,
                            (uint)(uVar13 == (ulong)local_c50._0_8_ >> 0x20));
        if (local_c50.pass != 0) {
          uVar12 = (uint)(instance->version != 0x10);
        }
        fill_block((__m128i *)local_438,
                   instance->memory + uVar13 * instance->lane_length + (ulong)uVar2,
                   instance->memory + uVar7,uVar12);
        uVar9 = uVar9 + 1;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (uVar9 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void fill_segment_sse2(const argon2_instance_t *instance,
                       argon2_position_t position)
{
    fill_segment_128(instance, position);
}